

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

int Extra_FileIsType(char *pFileName,char *pS1,char *pS2,char *pS3)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  sVar3 = strlen(pFileName);
  iVar2 = (int)sVar3;
  if (pS1 != (char *)0x0) {
    sVar3 = strlen(pS1);
    iVar1 = (int)sVar3;
    if ((iVar1 < iVar2 && iVar1 != 0) &&
       (iVar1 = strncmp(pFileName + ((long)iVar2 - (long)iVar1),pS1,(long)iVar1), iVar1 == 0)) {
      return 1;
    }
  }
  if (pS2 != (char *)0x0) {
    sVar3 = strlen(pS2);
    iVar1 = (int)sVar3;
    if ((iVar1 < iVar2 && iVar1 != 0) &&
       (iVar1 = strncmp(pFileName + ((long)iVar2 - (long)iVar1),pS2,(long)iVar1), iVar1 == 0)) {
      return 1;
    }
  }
  if (pS3 != (char *)0x0) {
    sVar3 = strlen(pS3);
    iVar1 = (int)sVar3;
    if ((iVar1 < iVar2 && iVar1 != 0) &&
       (iVar2 = strncmp(pFileName + ((long)iVar2 - (long)iVar1),pS3,(long)iVar1), iVar2 == 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int Extra_FileIsType( char * pFileName, char * pS1, char * pS2, char * pS3 )
{
    int lenS, lenF = strlen(pFileName);
    lenS = pS1 ? strlen(pS1) : 0;
    if ( lenS && lenF > lenS && !strncmp( pFileName+lenF-lenS, pS1, lenS ) )
        return 1;
    lenS = pS2 ? strlen(pS2) : 0;
    if ( lenS && lenF > lenS && !strncmp( pFileName+lenF-lenS, pS2, lenS ) )
        return 1;
    lenS = pS3 ? strlen(pS3) : 0;
    if ( lenS && lenF > lenS && !strncmp( pFileName+lenF-lenS, pS3, lenS ) )
        return 1;
    return 0;
}